

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithops.c
# Opt level: O0

LispPTR N_OP_makenumber(LispPTR tosm1,LispPTR tos)

{
  uint uVar1;
  uint *NAddr;
  int *fixpp;
  int result;
  LispPTR tos_local;
  LispPTR tosm1_local;
  
  if (((tosm1 & 0xffff0000) == 0xe0000) && ((tos & 0xffff0000) == 0xe0000)) {
    uVar1 = tosm1 << 0x10 | tos & 0xffff;
    if ((tosm1 & 0xffff) == 0xffff) {
      tos_local = tos & 0xffff | 0xf0000;
    }
    else if ((tosm1 & 0xffff) == 0) {
      tos_local = uVar1 | 0xe0000;
    }
    else {
      NAddr = (uint *)createcell68k(2);
      *NAddr = uVar1;
      tos_local = LAddrFromNative(NAddr);
    }
  }
  else {
    MachineState.errorexit = 1;
    tos_local = 0xffffffff;
    MachineState.tosvalue = tos;
  }
  return tos_local;
}

Assistant:

LispPTR N_OP_makenumber(LispPTR tosm1, LispPTR tos) {
  int result;

  if (((tosm1 & 0xFFFF0000) != S_POSITIVE) || ((tos & 0xFFFF0000) != S_POSITIVE)) ERROR_EXIT(tos);
  /* UB: left shift of 49152 by 16 places cannot be represented in type 'int' */
  result = (int)(((tosm1 & 0xffff) << 16) | (tos & 0xffff));
  N_ARITH_SWITCH(result);
}